

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<Clasp::MinimizeBuilder::MLit>(MLit *first,MLit *last,MLit *x)

{
  weight_t wVar1;
  uint uVar2;
  MLit *x_local;
  MLit *last_local;
  MLit *first_local;
  
  last_local._0_4_ = (int)last;
  first_local._0_4_ = (int)first;
  uVar2 = (int)last_local - (int)first_local;
  first_local = first;
  switch((uVar2 >> 2) * -0x55555555 & 7) {
  case 0:
    first_local = first;
    while (first_local != last) {
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_7:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_6:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_5:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_4:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_3:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_2:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
switchD_001ba058_caseD_1:
      wVar1 = x->prio;
      first_local->lit = (Literal)(x->lit).rep_;
      first_local->prio = wVar1;
      first_local->weight = x->weight;
      first_local = first_local + 1;
    }
    break;
  case 1:
    goto switchD_001ba058_caseD_1;
  case 2:
    goto switchD_001ba058_caseD_2;
  case 3:
    goto switchD_001ba058_caseD_3;
  case 4:
    goto switchD_001ba058_caseD_4;
  case 5:
    goto switchD_001ba058_caseD_5;
  case 6:
    goto switchD_001ba058_caseD_6;
  case 7:
    goto switchD_001ba058_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}